

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O1

void * __thiscall cs::token_base::operator_new(token_base *this,size_t size)

{
  undefined1 auVar1 [16];
  token_base *ptVar2;
  token_base **key;
  token_base *local_28;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>::iterator,_bool>
  local_20;
  
  ptVar2 = (token_base *)::operator_new((ulong)this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = ptVar2;
  local_28 = ptVar2;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
  ::emplace_decomposable<cs::token_base*,cs::token_base*>
            (&local_20,
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
              *)&gc,&local_28,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),&local_28);
  return ptVar2;
}

Assistant:

static void *operator new(std::size_t size)
		{
			void *ptr = ::operator new(size);
			gc.add(ptr);
			return ptr;
		}